

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5lib.c
# Opt level: O2

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t l;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t lcyphertext;
  byte local_2178 [16];
  char block [272];
  luaL_Buffer b;
  
  pcVar3 = luaL_checklstring((lua_State *)ctx,1,&lcyphertext);
  cVar1 = *pcVar3;
  uVar5 = (long)cVar1 + 1;
  if (0x10 < (ulong)(long)cVar1 || lcyphertext < uVar5) {
    luaL_argerror((lua_State *)ctx,1,"invalid cyphered string");
  }
  pcVar4 = pcVar3 + uVar5;
  lcyphertext = lcyphertext - uVar5;
  iVar2 = initblock((lua_State *)ctx,pcVar3 + 1,(int)cVar1,block);
  sVar7 = lcyphertext;
  luaL_buffinit((lua_State *)ctx,&b);
  for (; sVar7 != 0; sVar7 = sVar7 - l) {
    md5(block,(long)iVar2,(char *)local_2178);
    l = 0x10;
    if (sVar7 < 0x10) {
      l = sVar7;
    }
    for (sVar6 = 0; sVar6 != l; sVar6 = sVar6 + 1) {
      local_2178[sVar6] = local_2178[sVar6] ^ pcVar4[sVar6];
    }
    luaL_addlstring(&b,(char *)local_2178,l);
    pcVar4 = pcVar4 + sVar6;
    memcpy(block,pcVar4 + -l,l);
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int decrypt (lua_State *L) {
  size_t lcyphertext;
  const char *cyphertext = luaL_checklstring(L, 1, &lcyphertext);
  size_t lseed = cyphertext[0];
  const char *seed = cyphertext+1;
  int lblock;
  char block[BLOCKSIZE+MAXKEY];
  luaL_argcheck(L, lcyphertext >= lseed+1 && lseed <= BLOCKSIZE, 1,
                 "invalid cyphered string");
  cyphertext += lseed+1;
  lcyphertext -= lseed+1;
  lblock = initblock(L, seed, lseed, block);
  decodestream(L, cyphertext, lcyphertext, block, lblock);
  return 1;
}